

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ali_emr_list_config_type.cc
# Opt level: O1

int __thiscall
aliyun::Emr::ListConfigType
          (Emr *this,EmrListConfigTypeResponseType *response,EmrErrorInfo *error_info)

{
  iterator *piVar1;
  bool bVar2;
  int iVar3;
  ArrayIndex AVar4;
  char *pcVar5;
  AliRpcRequest *this_00;
  long *plVar6;
  size_t sVar7;
  Value *pVVar8;
  Value *pVVar9;
  Value *pVVar10;
  size_type *psVar11;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *vec;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *vec_00;
  uint uVar12;
  uint index;
  Value val;
  string str_response;
  string secheme;
  Reader reader;
  undefined1 local_3d8 [24];
  string local_3c0 [8];
  size_type local_3b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3b0;
  Value local_3a0;
  int local_384;
  EmrListConfigTypeResponseType *local_380;
  ValueHolder local_378;
  undefined8 uStack_370;
  ulong local_368 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_358;
  undefined8 uStack_350;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_348;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_338;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_328;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_318;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_308;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_2f8;
  undefined8 local_2f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2e8;
  undefined1 local_2d8;
  undefined1 local_2d7;
  undefined1 local_2d6;
  undefined1 local_2d5;
  Value *local_2d0;
  Value *local_2c8;
  string local_2c0;
  string local_2a0;
  long *local_280;
  long local_278;
  long local_270 [2];
  string local_260;
  string local_240;
  string local_220;
  string local_200;
  string local_1e0;
  string local_1c0;
  string local_1a0;
  string local_180;
  string local_160;
  Reader local_140;
  
  local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
  local_2a0._M_string_length = 0;
  local_2a0.field_2._M_local_buf[0] = '\0';
  pcVar5 = "http";
  if ((ulong)this->use_tls_ != 0) {
    pcVar5 = "https";
  }
  local_280 = local_270;
  local_380 = response;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_280,pcVar5,pcVar5 + (ulong)this->use_tls_ + 4);
  this_00 = (AliRpcRequest *)operator_new(0x2c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_160,this->version_,(allocator<char> *)&local_378.bool_);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_180,this->appid_,(allocator<char> *)local_3d8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1a0,this->secret_,(allocator<char> *)&local_2c0);
  piVar1 = &local_140.nodes_.c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
            _M_impl.super__Deque_impl_data._M_start;
  local_140.nodes_.c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
  super__Deque_impl_data._M_map = &piVar1->_M_cur;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_140,local_280,local_278 + (long)local_280);
  std::__cxx11::string::append((char *)&local_140);
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_140);
  psVar11 = (size_type *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar11) {
    local_260.field_2._M_allocated_capacity = *psVar11;
    local_260.field_2._8_8_ = plVar6[3];
    local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
  }
  else {
    local_260.field_2._M_allocated_capacity = *psVar11;
    local_260._M_dataplus._M_p = (pointer)*plVar6;
  }
  local_260._M_string_length = plVar6[1];
  *plVar6 = (long)psVar11;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  AliRpcRequest::AliRpcRequest(this_00,&local_160,&local_180,&local_1a0,&local_260);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_260._M_dataplus._M_p != &local_260.field_2) {
    operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
  }
  if ((iterator *)
      local_140.nodes_.c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
      super__Deque_impl_data._M_map != piVar1) {
    operator_delete(local_140.nodes_.c.
                    super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
                    super__Deque_impl_data._M_map,
                    (long)local_140.nodes_.c.
                          super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
                          super__Deque_impl_data._M_start._M_cur + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
    operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._M_dataplus._M_p != &local_180.field_2) {
    operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != &local_160.field_2) {
    operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
  }
  if (((this->use_tls_ == false) && (pcVar5 = this->proxy_host_, pcVar5 != (char *)0x0)) &&
     (*pcVar5 != '\0')) {
    local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
    sVar7 = strlen(pcVar5);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e0,pcVar5,pcVar5 + sVar7);
    AliHttpRequest::SetHttpProxy((AliHttpRequest *)this_00,&local_1e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
      operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
    }
  }
  Json::Value::Value(&local_3a0,nullValue);
  Json::Reader::Reader(&local_140);
  local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_200,"Action","");
  local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_220,"ListConfigType","");
  AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_200,&local_220);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220._M_dataplus._M_p != &local_220.field_2) {
    operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_dataplus._M_p != &local_200.field_2) {
    operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
  }
  if ((this->region_id_ != (char *)0x0) && (*this->region_id_ != '\0')) {
    local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_240,"RegionId","");
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1c0,this->region_id_,(allocator<char> *)&local_378.bool_);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_240,&local_1c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
      operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240._M_dataplus._M_p != &local_240.field_2) {
      operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
    }
  }
  iVar3 = (**(this_00->super_AliHttpRequest)._vptr_AliHttpRequest)(this_00);
  if (iVar3 == 0) {
    iVar3 = AliHttpRequest::WaitResponseHeaderComplete((AliHttpRequest *)this_00);
    AliHttpRequest::ReadResponseBody((AliHttpRequest *)this_00,&local_2a0);
    if (((0 < iVar3) && (local_2a0._M_string_length != 0)) &&
       (bVar2 = Json::Reader::parse(&local_140,&local_2a0,&local_3a0,true), bVar2)) {
      if (error_info != (EmrErrorInfo *)0x0 && iVar3 != 200) {
        bVar2 = Json::Value::isMember(&local_3a0,"RequestId");
        if (bVar2) {
          pVVar8 = Json::Value::operator[](&local_3a0,"RequestId");
          Json::Value::asString_abi_cxx11_((string *)&local_378,pVVar8);
        }
        else {
          local_378.string_ = (char *)local_368;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_378,anon_var_dwarf_1f029e + 9);
        }
        std::__cxx11::string::operator=((string *)error_info,(string *)&local_378.bool_);
        if (local_378 != local_368) {
          operator_delete(local_378.string_,local_368[0] + 1);
        }
        bVar2 = Json::Value::isMember(&local_3a0,"Code");
        if (bVar2) {
          pVVar8 = Json::Value::operator[](&local_3a0,"Code");
          Json::Value::asString_abi_cxx11_((string *)&local_378,pVVar8);
        }
        else {
          local_378.string_ = (char *)local_368;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_378,anon_var_dwarf_1f029e + 9);
        }
        std::__cxx11::string::operator=((string *)&error_info->code,(string *)&local_378.bool_);
        if (local_378 != local_368) {
          operator_delete(local_378.string_,local_368[0] + 1);
        }
        bVar2 = Json::Value::isMember(&local_3a0,"HostId");
        if (bVar2) {
          pVVar8 = Json::Value::operator[](&local_3a0,"HostId");
          Json::Value::asString_abi_cxx11_((string *)&local_378,pVVar8);
        }
        else {
          local_378.string_ = (char *)local_368;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_378,anon_var_dwarf_1f029e + 9);
        }
        std::__cxx11::string::operator=((string *)&error_info->host_id,(string *)&local_378.bool_);
        if (local_378 != local_368) {
          operator_delete(local_378.string_,local_368[0] + 1);
        }
        bVar2 = Json::Value::isMember(&local_3a0,"Message");
        if (bVar2) {
          pVVar8 = Json::Value::operator[](&local_3a0,"Message");
          Json::Value::asString_abi_cxx11_((string *)&local_378,pVVar8);
        }
        else {
          local_378.string_ = (char *)local_368;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_378,anon_var_dwarf_1f029e + 9);
        }
        std::__cxx11::string::operator=((string *)&error_info->message,(string *)&local_378.bool_);
        if (local_378 != local_368) {
          operator_delete(local_378.string_,local_368[0] + 1);
        }
      }
      if (local_380 != (EmrListConfigTypeResponseType *)0x0 && iVar3 == 200) {
        bVar2 = Json::Value::isMember(&local_3a0,"securityGroupTypes");
        local_384 = iVar3;
        if (bVar2) {
          pVVar8 = Json::Value::operator[](&local_3a0,"securityGroupTypes");
          bVar2 = Json::Value::isMember(pVVar8,"SecurityGroupType");
          if (bVar2) {
            pVVar8 = Json::Value::operator[](&local_3a0,"securityGroupTypes");
            pVVar8 = Json::Value::operator[](pVVar8,"SecurityGroupType");
            bVar2 = Json::Value::isArray(pVVar8);
            if ((bVar2) && (AVar4 = Json::Value::size(pVVar8), AVar4 != 0)) {
              uVar12 = 0;
              do {
                uStack_370 = 0;
                local_368[0] = local_368[0] & 0xffffffffffffff00;
                local_358 = &local_348;
                uStack_350 = 0;
                local_348._M_allocated_capacity =
                     local_348._M_allocated_capacity & 0xffffffffffffff00;
                local_338._M_allocated_capacity = (size_type)&local_328;
                local_338._8_8_ = 0;
                local_328._M_allocated_capacity =
                     local_328._M_allocated_capacity & 0xffffffffffffff00;
                local_378.string_ = (char *)local_368;
                pVVar9 = Json::Value::operator[](pVVar8,uVar12);
                bVar2 = Json::Value::isMember(pVVar9,"Name");
                if (bVar2) {
                  pVVar10 = Json::Value::operator[](pVVar9,"Name");
                  Json::Value::asString_abi_cxx11_((string *)local_3d8,pVVar10);
                  std::__cxx11::string::operator=((string *)&local_378.bool_,(string *)local_3d8);
                  if ((undefined1 *)local_3d8._0_8_ != local_3d8 + 0x10) {
                    operator_delete((void *)local_3d8._0_8_,local_3d8._16_8_ + 1);
                  }
                }
                bVar2 = Json::Value::isMember(pVVar9,"State");
                if (bVar2) {
                  pVVar10 = Json::Value::operator[](pVVar9,"State");
                  Json::Value::asString_abi_cxx11_((string *)local_3d8,pVVar10);
                  std::__cxx11::string::operator=((string *)&local_358,(string *)local_3d8);
                  if ((undefined1 *)local_3d8._0_8_ != local_3d8 + 0x10) {
                    operator_delete((void *)local_3d8._0_8_,local_3d8._16_8_ + 1);
                  }
                }
                bVar2 = Json::Value::isMember(pVVar9,"Id");
                if (bVar2) {
                  pVVar9 = Json::Value::operator[](pVVar9,"Id");
                  Json::Value::asString_abi_cxx11_((string *)local_3d8,pVVar9);
                  std::__cxx11::string::operator=
                            ((string *)local_338._M_local_buf,(string *)local_3d8);
                  if ((undefined1 *)local_3d8._0_8_ != local_3d8 + 0x10) {
                    operator_delete((void *)local_3d8._0_8_,local_3d8._16_8_ + 1);
                  }
                }
                std::
                vector<aliyun::EmrListConfigTypeSecurityGroupTypeType,_std::allocator<aliyun::EmrListConfigTypeSecurityGroupTypeType>_>
                ::push_back(&local_380->security_group_types,(value_type *)&local_378);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_338._M_allocated_capacity != &local_328) {
                  operator_delete((void *)local_338._M_allocated_capacity,
                                  local_328._M_allocated_capacity + 1);
                }
                if (local_358 != &local_348) {
                  operator_delete(local_358,local_348._M_allocated_capacity + 1);
                }
                if (local_378 != local_368) {
                  operator_delete(local_378.string_,local_368[0] + 1);
                }
                AVar4 = Json::Value::size(pVVar8);
                uVar12 = uVar12 + 1;
              } while (uVar12 < AVar4);
            }
          }
        }
        bVar2 = Json::Value::isMember(&local_3a0,"instanceTypes");
        if (bVar2) {
          pVVar8 = Json::Value::operator[](&local_3a0,"instanceTypes");
          bVar2 = Json::Value::isMember(pVVar8,"InstanceType");
          if (bVar2) {
            pVVar8 = Json::Value::operator[](&local_3a0,"instanceTypes");
            pVVar8 = Json::Value::operator[](pVVar8,"InstanceType");
            bVar2 = Json::Value::isArray(pVVar8);
            local_2d0 = pVVar8;
            if ((bVar2) && (AVar4 = Json::Value::size(pVVar8), AVar4 != 0)) {
              local_2c8 = (Value *)&local_380->instance_types;
              uVar12 = 0;
              do {
                uStack_370 = 0;
                local_368[0] = local_368[0] & 0xffffffffffffff00;
                local_358 = &local_348;
                uStack_350 = 0;
                local_348._M_allocated_capacity =
                     local_348._M_allocated_capacity & 0xffffffffffffff00;
                local_338._M_allocated_capacity = (size_type)&local_328;
                local_338._8_8_ = 0;
                local_328._M_allocated_capacity =
                     local_328._M_allocated_capacity & 0xffffffffffffff00;
                local_318._M_allocated_capacity = (size_type)&local_308;
                local_318._8_8_ = 0;
                local_308._M_local_buf[0] = '\0';
                local_2f8 = &local_2e8;
                local_2f0 = 0;
                local_2e8._M_local_buf[0] = '\0';
                local_378.string_ = (char *)local_368;
                pVVar8 = Json::Value::operator[](local_2d0,uVar12);
                bVar2 = Json::Value::isMember(pVVar8,"Classify");
                if (bVar2) {
                  pVVar9 = Json::Value::operator[](pVVar8,"Classify");
                  Json::Value::asString_abi_cxx11_((string *)local_3d8,pVVar9);
                  std::__cxx11::string::operator=((string *)&local_378.bool_,(string *)local_3d8);
                  if ((undefined1 *)local_3d8._0_8_ != local_3d8 + 0x10) {
                    operator_delete((void *)local_3d8._0_8_,local_3d8._16_8_ + 1);
                  }
                }
                bVar2 = Json::Value::isMember(pVVar8,"State");
                if (bVar2) {
                  pVVar9 = Json::Value::operator[](pVVar8,"State");
                  Json::Value::asString_abi_cxx11_((string *)local_3d8,pVVar9);
                  std::__cxx11::string::operator=((string *)&local_358,(string *)local_3d8);
                  if ((undefined1 *)local_3d8._0_8_ != local_3d8 + 0x10) {
                    operator_delete((void *)local_3d8._0_8_,local_3d8._16_8_ + 1);
                  }
                }
                bVar2 = Json::Value::isMember(pVVar8,"Type");
                if (bVar2) {
                  pVVar9 = Json::Value::operator[](pVVar8,"Type");
                  Json::Value::asString_abi_cxx11_((string *)local_3d8,pVVar9);
                  std::__cxx11::string::operator=
                            ((string *)local_338._M_local_buf,(string *)local_3d8);
                  if ((undefined1 *)local_3d8._0_8_ != local_3d8 + 0x10) {
                    operator_delete((void *)local_3d8._0_8_,local_3d8._16_8_ + 1);
                  }
                }
                bVar2 = Json::Value::isMember(pVVar8,"CpuCore");
                if (bVar2) {
                  pVVar9 = Json::Value::operator[](pVVar8,"CpuCore");
                  Json::Value::asString_abi_cxx11_((string *)local_3d8,pVVar9);
                  std::__cxx11::string::operator=
                            ((string *)local_318._M_local_buf,(string *)local_3d8);
                  if ((undefined1 *)local_3d8._0_8_ != local_3d8 + 0x10) {
                    operator_delete((void *)local_3d8._0_8_,local_3d8._16_8_ + 1);
                  }
                }
                bVar2 = Json::Value::isMember(pVVar8,"MemSize");
                if (bVar2) {
                  pVVar9 = Json::Value::operator[](pVVar8,"MemSize");
                  Json::Value::asString_abi_cxx11_((string *)local_3d8,pVVar9);
                  std::__cxx11::string::operator=((string *)&local_2f8,(string *)local_3d8);
                  if ((undefined1 *)local_3d8._0_8_ != local_3d8 + 0x10) {
                    operator_delete((void *)local_3d8._0_8_,local_3d8._16_8_ + 1);
                  }
                }
                bVar2 = Json::Value::isMember(pVVar8,"HasCloudDisk");
                if (bVar2) {
                  pVVar9 = Json::Value::operator[](pVVar8,"HasCloudDisk");
                  local_2d8 = Json::Value::asBool(pVVar9);
                }
                bVar2 = Json::Value::isMember(pVVar8,"HasLocalDisk");
                if (bVar2) {
                  pVVar9 = Json::Value::operator[](pVVar8,"HasLocalDisk");
                  local_2d7 = Json::Value::asBool(pVVar9);
                }
                bVar2 = Json::Value::isMember(pVVar8,"HasLocalSSD");
                if (bVar2) {
                  pVVar9 = Json::Value::operator[](pVVar8,"HasLocalSSD");
                  local_2d6 = Json::Value::asBool(pVVar9);
                }
                bVar2 = Json::Value::isMember(pVVar8,"HasCloudSSD");
                if (bVar2) {
                  pVVar8 = Json::Value::operator[](pVVar8,"HasCloudSSD");
                  local_2d5 = Json::Value::asBool(pVVar8);
                }
                std::
                vector<aliyun::EmrListConfigTypeInstanceTypeType,_std::allocator<aliyun::EmrListConfigTypeInstanceTypeType>_>
                ::push_back((vector<aliyun::EmrListConfigTypeInstanceTypeType,_std::allocator<aliyun::EmrListConfigTypeInstanceTypeType>_>
                             *)local_2c8,(value_type *)&local_378);
                if (local_2f8 != &local_2e8) {
                  operator_delete(local_2f8,
                                  CONCAT71(local_2e8._M_allocated_capacity._1_7_,
                                           local_2e8._M_local_buf[0]) + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_318._M_allocated_capacity != &local_308) {
                  operator_delete((void *)local_318._M_allocated_capacity,
                                  CONCAT71(local_308._M_allocated_capacity._1_7_,
                                           local_308._M_local_buf[0]) + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_338._M_allocated_capacity != &local_328) {
                  operator_delete((void *)local_338._M_allocated_capacity,
                                  local_328._M_allocated_capacity + 1);
                }
                if (local_358 != &local_348) {
                  operator_delete(local_358,local_348._M_allocated_capacity + 1);
                }
                if (local_378 != local_368) {
                  operator_delete(local_378.string_,local_368[0] + 1);
                }
                AVar4 = Json::Value::size(local_2d0);
                uVar12 = uVar12 + 1;
              } while (uVar12 < AVar4);
            }
          }
        }
        bVar2 = Json::Value::isMember(&local_3a0,"EmrVerTypes");
        iVar3 = local_384;
        if (bVar2) {
          pVVar8 = Json::Value::operator[](&local_3a0,"EmrVerTypes");
          bVar2 = Json::Value::isMember(pVVar8,"EmrVerType");
          if (bVar2) {
            pVVar8 = Json::Value::operator[](&local_3a0,"EmrVerTypes");
            pVVar8 = Json::Value::operator[](pVVar8,"EmrVerType");
            bVar2 = Json::Value::isArray(pVVar8);
            if ((bVar2) && (AVar4 = Json::Value::size(pVVar8), AVar4 != 0)) {
              local_2d0 = (Value *)&local_380->emr_ver_types;
              uVar12 = 0;
              local_2c8 = pVVar8;
              do {
                local_3d8._0_8_ = (pointer)0x0;
                local_3d8._8_8_ = (pointer)0x0;
                local_3d8._16_8_ = 0;
                local_3c0 = (string  [8])&local_3b0;
                local_3b8 = 0;
                local_3b0._M_local_buf[0] = '\0';
                pVVar8 = Json::Value::operator[](pVVar8,uVar12);
                bVar2 = Json::Value::isMember(pVVar8,"Name");
                if (bVar2) {
                  pVVar9 = Json::Value::operator[](pVVar8,"Name");
                  Json::Value::asString_abi_cxx11_((string *)&local_378,pVVar9);
                  std::__cxx11::string::operator=(local_3c0,(string *)&local_378.bool_);
                  if (local_378 != local_368) {
                    operator_delete(local_378.string_,local_368[0] + 1);
                  }
                }
                bVar2 = Json::Value::isMember(pVVar8,"SubModules");
                if (bVar2) {
                  pVVar9 = Json::Value::operator[](pVVar8,"SubModules");
                  bVar2 = Json::Value::isMember(pVVar9,"SubModule");
                  if (bVar2) {
                    pVVar8 = Json::Value::operator[](pVVar8,"SubModules");
                    pVVar8 = Json::Value::operator[](pVVar8,"SubModule");
                    bVar2 = Json::Value::isArray(pVVar8);
                    if ((bVar2) && (AVar4 = Json::Value::size(pVVar8), AVar4 != 0)) {
                      index = 0;
                      do {
                        local_378.string_ = (char *)local_368;
                        uStack_370 = 0;
                        local_368[0] = local_368[0] & 0xffffffffffffff00;
                        local_358 = &local_348;
                        uStack_350 = 0;
                        local_348._M_allocated_capacity =
                             local_348._M_allocated_capacity & 0xffffffffffffff00;
                        local_338._M_allocated_capacity = (size_type)&local_328;
                        local_338._8_8_ = 0;
                        local_328._M_allocated_capacity =
                             local_328._M_allocated_capacity & 0xffffffffffffff00;
                        pVVar9 = Json::Value::operator[](pVVar8,index);
                        bVar2 = Json::Value::isMember(pVVar9,"Name");
                        if (bVar2) {
                          pVVar10 = Json::Value::operator[](pVVar9,"Name");
                          Json::Value::asString_abi_cxx11_(&local_2c0,pVVar10);
                          std::__cxx11::string::operator=
                                    ((string *)&local_378.bool_,(string *)&local_2c0);
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
                            operator_delete(local_2c0._M_dataplus._M_p,
                                            local_2c0.field_2._M_allocated_capacity + 1);
                          }
                        }
                        bVar2 = Json::Value::isMember(pVVar9,"Required");
                        if (bVar2) {
                          pVVar10 = Json::Value::operator[](pVVar9,"Required");
                          Json::Value::asString_abi_cxx11_(&local_2c0,pVVar10);
                          std::__cxx11::string::operator=((string *)&local_358,(string *)&local_2c0)
                          ;
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
                            operator_delete(local_2c0._M_dataplus._M_p,
                                            local_2c0.field_2._M_allocated_capacity + 1);
                          }
                        }
                        bVar2 = Json::Value::isMember(pVVar9,"Optional");
                        if (bVar2) {
                          pVVar9 = Json::Value::operator[](pVVar9,"Optional");
                          Json::Value::asString_abi_cxx11_(&local_2c0,pVVar9);
                          std::__cxx11::string::operator=
                                    ((string *)local_338._M_local_buf,(string *)&local_2c0);
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
                            operator_delete(local_2c0._M_dataplus._M_p,
                                            local_2c0.field_2._M_allocated_capacity + 1);
                          }
                        }
                        std::
                        vector<aliyun::EmrListConfigTypeSubModuleType,_std::allocator<aliyun::EmrListConfigTypeSubModuleType>_>
                        ::push_back((vector<aliyun::EmrListConfigTypeSubModuleType,_std::allocator<aliyun::EmrListConfigTypeSubModuleType>_>
                                     *)local_3d8,(value_type *)&local_378);
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_338._M_allocated_capacity != &local_328) {
                          operator_delete((void *)local_338._M_allocated_capacity,
                                          local_328._M_allocated_capacity + 1);
                        }
                        if (local_358 != &local_348) {
                          operator_delete(local_358,local_348._M_allocated_capacity + 1);
                        }
                        if (local_378 != local_368) {
                          operator_delete(local_378.string_,local_368[0] + 1);
                        }
                        AVar4 = Json::Value::size(pVVar8);
                        index = index + 1;
                      } while (index < AVar4);
                    }
                  }
                }
                std::
                vector<aliyun::EmrListConfigTypeEmrVerTypeType,_std::allocator<aliyun::EmrListConfigTypeEmrVerTypeType>_>
                ::push_back((vector<aliyun::EmrListConfigTypeEmrVerTypeType,_std::allocator<aliyun::EmrListConfigTypeEmrVerTypeType>_>
                             *)local_2d0,(value_type *)local_3d8);
                iVar3 = local_384;
                if (local_3c0 != (string  [8])&local_3b0) {
                  operator_delete((void *)local_3c0,
                                  CONCAT71(local_3b0._M_allocated_capacity._1_7_,
                                           local_3b0._M_local_buf[0]) + 1);
                }
                std::
                vector<aliyun::EmrListConfigTypeSubModuleType,_std::allocator<aliyun::EmrListConfigTypeSubModuleType>_>
                ::~vector((vector<aliyun::EmrListConfigTypeSubModuleType,_std::allocator<aliyun::EmrListConfigTypeSubModuleType>_>
                           *)local_3d8);
                pVVar8 = local_2c8;
                AVar4 = Json::Value::size(local_2c8);
                uVar12 = uVar12 + 1;
              } while (uVar12 < AVar4);
            }
          }
        }
        bVar2 = Json::Value::isMember(&local_3a0,"ZoneTypes");
        if (bVar2) {
          pVVar8 = Json::Value::operator[](&local_3a0,"ZoneTypes");
          bVar2 = Json::Value::isMember(pVVar8,"ZoneType");
          if (bVar2) {
            pVVar8 = Json::Value::operator[](&local_3a0,"ZoneTypes");
            pVVar8 = Json::Value::operator[](pVVar8,"ZoneType");
            bVar2 = Json::Value::isArray(pVVar8);
            if ((bVar2) && (AVar4 = Json::Value::size(pVVar8), AVar4 != 0)) {
              local_380 = (EmrListConfigTypeResponseType *)&local_380->zone_types;
              uVar12 = 0;
              do {
                local_358 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)0x0;
                uStack_350 = 0;
                local_368[0] = 0;
                local_368[1] = 0;
                local_378.int_ = 0;
                uStack_370 = 0;
                local_348._8_8_ = 0;
                local_338._M_allocated_capacity =
                     local_338._M_allocated_capacity & 0xffffffffffffff00;
                local_328._M_allocated_capacity = (size_type)&local_318;
                local_328._8_8_ = 0;
                local_318._M_allocated_capacity =
                     local_318._M_allocated_capacity & 0xffffffffffffff00;
                local_348._M_allocated_capacity = (size_type)&local_338;
                pVVar9 = Json::Value::operator[](pVVar8,uVar12);
                bVar2 = Json::Value::isMember(pVVar9,"Name");
                if (bVar2) {
                  pVVar10 = Json::Value::operator[](pVVar9,"Name");
                  Json::Value::asString_abi_cxx11_((string *)local_3d8,pVVar10);
                  std::__cxx11::string::operator=
                            ((string *)local_348._M_local_buf,(string *)local_3d8);
                  if ((undefined1 *)local_3d8._0_8_ != local_3d8 + 0x10) {
                    operator_delete((void *)local_3d8._0_8_,local_3d8._16_8_ + 1);
                  }
                }
                bVar2 = Json::Value::isMember(pVVar9,"Id");
                if (bVar2) {
                  pVVar10 = Json::Value::operator[](pVVar9,"Id");
                  Json::Value::asString_abi_cxx11_((string *)local_3d8,pVVar10);
                  std::__cxx11::string::operator=
                            ((string *)local_328._M_local_buf,(string *)local_3d8);
                  if ((undefined1 *)local_3d8._0_8_ != local_3d8 + 0x10) {
                    operator_delete((void *)local_3d8._0_8_,local_3d8._16_8_ + 1);
                  }
                }
                bVar2 = Json::Value::isMember(pVVar9,"AvailableResourceCreateionList");
                if (bVar2) {
                  pVVar10 = Json::Value::operator[](pVVar9,"AvailableResourceCreateionList");
                  bVar2 = Json::Value::isMember(pVVar10,"AvailableResourceCreateion");
                  if (bVar2) {
                    pVVar10 = Json::Value::operator[](pVVar9,"AvailableResourceCreateionList");
                    pVVar10 = Json::Value::operator[](pVVar10,"AvailableResourceCreateion");
                    anon_unknown.dwarf_9de2b::
                    Json2Array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::Json2Array((Json2Array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)pVVar10,(Value *)&local_378,vec);
                  }
                }
                bVar2 = Json::Value::isMember(pVVar9,"AvailableDiskCategoriesList");
                if (bVar2) {
                  pVVar10 = Json::Value::operator[](pVVar9,"AvailableDiskCategoriesList");
                  bVar2 = Json::Value::isMember(pVVar10,"AvailableDiskCategories");
                  if (bVar2) {
                    pVVar9 = Json::Value::operator[](pVVar9,"AvailableDiskCategoriesList");
                    pVVar9 = Json::Value::operator[](pVVar9,"AvailableDiskCategories");
                    anon_unknown.dwarf_9de2b::
                    Json2Array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::Json2Array((Json2Array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)pVVar9,(Value *)(local_368 + 1),vec_00);
                  }
                }
                std::
                vector<aliyun::EmrListConfigTypeZoneTypeType,_std::allocator<aliyun::EmrListConfigTypeZoneTypeType>_>
                ::push_back((vector<aliyun::EmrListConfigTypeZoneTypeType,_std::allocator<aliyun::EmrListConfigTypeZoneTypeType>_>
                             *)local_380,(value_type *)&local_378);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_328._M_allocated_capacity != &local_318) {
                  operator_delete((void *)local_328._M_allocated_capacity,
                                  local_318._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_348._M_allocated_capacity != &local_338) {
                  operator_delete((void *)local_348._M_allocated_capacity,
                                  local_338._M_allocated_capacity + 1);
                }
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)(local_368 + 1));
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&local_378);
                AVar4 = Json::Value::size(pVVar8);
                uVar12 = uVar12 + 1;
                iVar3 = local_384;
              } while (uVar12 < AVar4);
            }
          }
        }
      }
      goto LAB_0013d269;
    }
    if (error_info == (EmrErrorInfo *)0x0) goto LAB_0013d263;
    pcVar5 = "parse response failed";
  }
  else {
    if (error_info == (EmrErrorInfo *)0x0) {
LAB_0013d263:
      iVar3 = -1;
      goto LAB_0013d269;
    }
    pcVar5 = "connect to host failed";
  }
  std::__cxx11::string::_M_replace
            ((ulong)&error_info->code,0,(char *)(error_info->code)._M_string_length,(ulong)pcVar5);
  iVar3 = -1;
LAB_0013d269:
  AliRpcRequest::~AliRpcRequest(this_00);
  operator_delete(this_00,0x2c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140.commentsBefore_._M_dataplus._M_p != &local_140.commentsBefore_.field_2) {
    operator_delete(local_140.commentsBefore_._M_dataplus._M_p,
                    local_140.commentsBefore_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140.document_._M_dataplus._M_p != &local_140.document_.field_2) {
    operator_delete(local_140.document_._M_dataplus._M_p,
                    local_140.document_.field_2._M_allocated_capacity + 1);
  }
  std::deque<Json::Reader::ErrorInfo,_std::allocator<Json::Reader::ErrorInfo>_>::~deque
            (&local_140.errors_);
  std::_Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>::~_Deque_base
            ((_Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_> *)&local_140);
  Json::Value::~Value(&local_3a0);
  if (local_280 != local_270) {
    operator_delete(local_280,local_270[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
    operator_delete(local_2a0._M_dataplus._M_p,
                    CONCAT71(local_2a0.field_2._M_allocated_capacity._1_7_,
                             local_2a0.field_2._M_local_buf[0]) + 1);
  }
  return iVar3;
}

Assistant:

int Emr::ListConfigType(EmrListConfigTypeResponseType* response,
                       EmrErrorInfo* error_info) {
  std::string str_response;
  int status_code;
  int ret = 0;
  bool parse_success = false;
  std::string secheme = this->use_tls_ ? "https" : "http";
  AliRpcRequest* req_rpc = new AliRpcRequest(version_,
                         appid_,
                         secret_,
                         secheme + "://" + host_);
  if((!this->use_tls_) && this->proxy_host_ && this->proxy_host_[0]) {
    req_rpc->SetHttpProxy( this->proxy_host_);
  }
  Json::Value val;
  Json::Reader reader;
  req_rpc->AddRequestQuery("Action","ListConfigType");
  if(this->region_id_ && this->region_id_[0]) {
    req_rpc->AddRequestQuery("RegionId", this->region_id_);
  }
  if(req_rpc->CommitRequest() != 0) {
     if(error_info) {
       error_info->code = "connect to host failed";
     }
     ret = -1;
     goto out;
  }
  status_code = req_rpc->WaitResponseHeaderComplete();
  req_rpc->ReadResponseBody(str_response);
  if(status_code > 0 && !str_response.empty()){
    parse_success = reader.parse(str_response, val);
  }
  if(!parse_success) {
    if(error_info) {
      error_info->code = "parse response failed";
    }
    ret = -1;
    goto out;
  }
  if(status_code!= 200 && error_info && parse_success) {
    error_info->request_id = val.isMember("RequestId") ? val["RequestId"].asString(): "";
    error_info->code = val.isMember("Code") ? val["Code"].asString(): "";
    error_info->host_id = val.isMember("HostId") ? val["HostId"].asString(): "";
    error_info->message = val.isMember("Message") ? val["Message"].asString(): "";
  }
  if(status_code== 200 && response) {
    Json2Type(val, response);
  }
  ret = status_code;
out:
  delete req_rpc;
  return ret;
}